

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall
cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
          (cmFileListGeneratorCaseInsensitive *this,cmFileListGeneratorCaseInsensitive *r)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorCaseInsensitive_0078a290;
  (this->String)._M_dataplus._M_p = (pointer)&(this->String).field_2;
  pcVar1 = (r->String)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->String,pcVar1,pcVar1 + (r->String)._M_string_length);
  return;
}

Assistant:

cmFileListGeneratorCaseInsensitive(
    cmFileListGeneratorCaseInsensitive const& r)
    : cmFileListGeneratorBase()
    , String(r.String)
  {
  }